

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegexpExec(xmlRegexpPtr comp,xmlChar *content)

{
  xmlRegTrans *pxVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegCounter *pxVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  xmlRegStatePtr extraout_RAX;
  xmlRegStatePtr pxVar8;
  xmlRegStatePtr extraout_RAX_00;
  bool bVar9;
  int iVar10;
  long lVar11;
  int i;
  long lVar12;
  bool bVar13;
  int len;
  xmlRegExecCtxt execval;
  uint local_e4;
  xmlRegExecCtxt local_e0;
  int local_44;
  xmlRegStatePtr local_40;
  xmlRegStatePtr local_38;
  
  iVar7 = -1;
  if (content != (xmlChar *)0x0 && comp != (xmlRegexpPtr)0x0) {
    local_e0.index = 0;
    local_e0.nbPush = 0;
    local_e0.status = 0;
    local_e0.determinist = 1;
    local_e0.maxRollbacks = 0;
    local_e0.nbRollbacks = 0;
    local_e0.rollbacks = (xmlRegExecRollback *)0x0;
    local_e0.state = *comp->states;
    local_e0.transno = 0;
    local_e0.transcount = 0;
    local_e0.inputStack = (xmlRegInputTokenPtr)0x0;
    local_e0.inputStackMax = 0;
    local_e0.comp = comp;
    local_e0.inputString = content;
    if ((long)comp->nbCounters < 1) {
      local_e0.counts = (int *)0x0;
    }
    else {
      local_e0.counts = (int *)(*xmlMalloc)((long)comp->nbCounters << 2);
      if ((xmlRegStatePtr)local_e0.counts == (xmlRegStatePtr)0x0) {
        return -5;
      }
      memset(local_e0.counts,0,(long)comp->nbCounters << 2);
    }
    do {
      if (((local_e0.status != 0) || (local_e0.state == (xmlRegStatePtr)0x0)) ||
         ((local_e0.inputString[local_e0.index] == '\0' &&
          ((local_e0.state)->type == XML_REGEXP_FINAL_STATE)))) goto LAB_0017daea;
      local_e4 = 1;
      if (((local_e0.inputString[local_e0.index] == '\0') &&
          ((xmlRegStatePtr)local_e0.counts == (xmlRegStatePtr)0x0)) &&
         (((local_e0.state)->nbTrans <= local_e0.transno ||
          ((-1 < (local_e0.state)->trans[local_e0.transno].to &&
           ((pxVar2 = (local_e0.state)->trans[local_e0.transno].atom, pxVar2->min != 0 ||
            (pxVar2->max < 1)))))))) {
LAB_0017da96:
        local_e0._0_8_ = local_e0._0_8_ & 0xffffffff;
        xmlFARegExecRollBack(&local_e0);
        iVar10 = 2;
        pxVar8 = extraout_RAX_00;
      }
      else {
        local_e0.transcount = 0;
        for (; local_e0.transno < (local_e0.state)->nbTrans; local_e0.transno = local_e0.transno + 1
            ) {
          if (-1 < (local_e0.state)->trans[local_e0.transno].to) {
            pxVar1 = (local_e0.state)->trans + local_e0.transno;
            lVar11 = (long)pxVar1->count;
            if (lVar11 < 0) {
              pxVar2 = pxVar1->atom;
              if (pxVar2 != (xmlRegAtomPtr)0x0) {
                if (local_e0.inputString[local_e0.index] == '\0') {
LAB_0017d855:
                  bVar13 = true;
                  uVar6 = 0;
                  if ((pxVar2->min == 0) && (uVar6 = 0, 0 < pxVar2->max)) {
                    local_e0.transcount = 1;
                    local_e4 = 0;
                    uVar6 = 1;
                  }
                  goto LAB_0017d787;
                }
                local_e4 = 4;
                uVar6 = xmlGetUTF8Char(local_e0.inputString + local_e0.index,(int *)&local_e4);
                pxVar8 = (xmlRegStatePtr)(ulong)uVar6;
                if ((int)uVar6 < 0) {
                  local_e0.status = 0xfffffff9;
LAB_0017dada:
                  iVar10 = 8;
                }
                else {
                  uVar6 = xmlRegCheckCharacter(pxVar2,uVar6);
                  bVar13 = true;
                  if (uVar6 == 0) goto LAB_0017d855;
                  if (((uVar6 != 1) || (pxVar2->min < 0)) || (pxVar2->max < 1)) goto LAB_0017d787;
                  local_38 = comp->states[pxVar1->to];
                  lVar11 = (long)pxVar1->counter;
                  if (lVar11 < 0) {
LAB_0017d8a3:
                    if (local_e0.transno + 1 < (local_e0.state)->nbTrans) {
                      xmlFARegExecSave(&local_e0);
                      if (local_e0.status != 0) {
LAB_0017d9f9:
                        pxVar8 = (xmlRegStatePtr)&DAT_00000001;
                        iVar10 = 8;
                        goto LAB_0017da1b;
                      }
                    }
                    if (-1 < (long)pxVar1->counter) {
                      ((xmlRegStateType *)local_e0.counts)[pxVar1->counter] =
                           ((xmlRegStateType *)local_e0.counts)[pxVar1->counter] +
                           XML_REGEXP_START_STATE;
                    }
                    local_e0.transcount = 1;
                    do {
                      uVar6 = 1;
                      if ((local_e0.transcount == pxVar2->max) ||
                         (iVar7 = (int)((long)(int)local_e4 + (long)local_e0.index),
                         local_e0.inputString[(long)(int)local_e4 + (long)local_e0.index] == '\0'))
                      break;
                      local_e0.index = iVar7;
                      if (pxVar2->min <= local_e0.transcount) {
                        local_44 = local_e0.transno;
                        local_40 = local_e0.state;
                        local_e0.transno = -1;
                        local_e0.state = local_38;
                        xmlFARegExecSave(&local_e0);
                        iVar10 = 8;
                        if (local_e0.status != 0) {
                          pxVar8 = (xmlRegStatePtr)&DAT_00000001;
                          goto LAB_0017da1b;
                        }
                        local_e0.transno = local_44;
                        local_e0.state = local_40;
                      }
                      local_e4 = 4;
                      iVar7 = xmlGetUTF8Char(local_e0.inputString + local_e0.index,(int *)&local_e4)
                      ;
                      if (iVar7 < 0) {
                        local_e0.status = 0xfffffff9;
                        goto LAB_0017d9f9;
                      }
                      uVar6 = xmlRegCheckCharacter(pxVar2,iVar7);
                      local_e0.transcount = local_e0.transcount + 1;
                    } while (uVar6 == 1);
                    if (local_e0.transcount < pxVar2->min) {
                      uVar6 = 0;
                    }
                    uVar5 = uVar6;
                    if ((int)uVar6 < 1) {
                      uVar5 = 0;
                    }
                    pxVar8 = (xmlRegStatePtr)(ulong)uVar5;
                    if ((int)uVar6 < 1) {
                      iVar10 = 4;
                      pxVar8 = (xmlRegStatePtr)0x0;
                    }
                    else {
                      iVar10 = 0;
                      if (-1 < (long)pxVar1->counter) {
                        if ((xmlRegStatePtr)local_e0.counts == (xmlRegStatePtr)0x0) {
                          local_e0.status = 0xfffffffc;
                          iVar10 = 8;
                        }
                        else {
                          ((xmlRegStateType *)local_e0.counts)[pxVar1->counter] =
                               ((xmlRegStateType *)local_e0.counts)[pxVar1->counter] -
                               XML_REGEXP_START_STATE;
                        }
                      }
                    }
                  }
                  else {
                    if ((((xmlRegStatePtr)local_e0.counts == (xmlRegStatePtr)0x0) ||
                        (local_e0.comp == (xmlRegexpPtr)0x0)) ||
                       ((local_e0.comp)->counters == (xmlRegCounter *)0x0)) {
                      local_e0.status = 0xfffffffc;
                      iVar10 = 8;
                      bVar9 = false;
                    }
                    else {
                      iVar7 = (local_e0.comp)->counters[lVar11].max;
                      bVar9 = (int)((xmlRegStateType *)local_e0.counts)[lVar11] < iVar7;
                      iVar10 = 7;
                      if ((int)((xmlRegStateType *)local_e0.counts)[lVar11] < iVar7) {
                        iVar10 = 0;
                      }
                    }
                    pxVar8 = (xmlRegStatePtr)&DAT_00000001;
                    if (bVar9) goto LAB_0017d8a3;
                  }
LAB_0017da1b:
                  uVar6 = (uint)pxVar8;
                  if (iVar10 == 0) goto LAB_0017d787;
                  if (iVar10 == 7) goto LAB_0017d80a;
                  if (iVar10 == 4) goto LAB_0017da96;
                }
                goto LAB_0017daab;
              }
            }
            else {
              if ((xmlRegStatePtr)local_e0.counts == (xmlRegStatePtr)0x0) {
                local_e0.status = 0xfffffffc;
                bVar13 = true;
                iVar10 = 8;
                bVar9 = false;
              }
              else {
                pxVar3 = (local_e0.comp)->counters;
                iVar10 = 0;
                bVar9 = false;
                if (pxVar3[lVar11].min <= (int)((xmlRegStateType *)local_e0.counts)[lVar11]) {
                  bVar9 = (int)((xmlRegStateType *)local_e0.counts)[lVar11] <= pxVar3[lVar11].max;
                }
                bVar13 = true;
                if (bVar9 != false) {
                  bVar13 = pxVar3[lVar11].min == pxVar3[lVar11].max;
                }
              }
              pxVar8 = (xmlRegStatePtr)local_e0.counts;
              if ((xmlRegStatePtr)local_e0.counts == (xmlRegStatePtr)0x0) goto LAB_0017daab;
              uVar6 = (uint)bVar9;
LAB_0017d787:
              if (uVar6 == 1) {
                if ((pxVar1->nd == 1) ||
                   (((!bVar13 && (-1 < pxVar1->count)) &&
                    (local_e0.transno + 1 < (local_e0.state)->nbTrans)))) {
                  xmlFARegExecSave(&local_e0);
                  pxVar8 = extraout_RAX;
                  if (local_e0.status != 0) goto LAB_0017dada;
                }
                pxVar8 = (xmlRegStatePtr)(long)pxVar1->counter;
                if (-1 < (long)pxVar8) {
                  if ((((xmlRegStatePtr)local_e0.counts == (xmlRegStatePtr)0x0) ||
                      (local_e0.comp == (xmlRegexpPtr)0x0)) ||
                     ((local_e0.comp)->counters == (xmlRegCounter *)0x0)) {
                    local_e0.status = 0xfffffffc;
                    iVar10 = 8;
                  }
                  else {
                    iVar10 = 7;
                    if ((int)((xmlRegStateType *)local_e0.counts)[(long)pxVar8] <
                        (local_e0.comp)->counters[(long)pxVar8].max) {
                      ((xmlRegStateType *)local_e0.counts)[(long)pxVar8] =
                           ((xmlRegStateType *)local_e0.counts)[(long)pxVar8] +
                           XML_REGEXP_START_STATE;
                      iVar10 = 0;
                    }
                  }
                  if (iVar10 == 7) goto LAB_0017d80a;
                  if (iVar10 != 0) goto LAB_0017daab;
                }
                pxVar8 = (xmlRegStatePtr)(ulong)(uint)pxVar1->count;
                if (pxVar8 < (xmlRegStatePtr)((long)&__DT_JMPREL[0x153].r_addend + 6)) {
                  if ((xmlRegStatePtr)local_e0.counts == (xmlRegStatePtr)0x0) {
                    local_e0.status = 0xfffffffc;
                    goto LAB_0017dada;
                  }
                  ((xmlRegStateType *)local_e0.counts)[(long)pxVar8] = 0;
                }
                local_e0.state = comp->states[pxVar1->to];
                local_e0.transno = 0;
                iVar10 = 2;
                pxVar8 = local_e0.state;
                if (pxVar1->atom != (xmlRegAtomPtr)0x0) {
                  pxVar8 = (xmlRegStatePtr)(ulong)local_e4;
                  local_e0.index = local_e0.index + local_e4;
                }
                goto LAB_0017daab;
              }
              if (-1 < (int)uVar6) goto LAB_0017d80a;
            }
            local_e0.status = 0xfffffffc;
            break;
          }
LAB_0017d80a:
        }
        if ((local_e0.transno != 0) ||
           (iVar10 = 2, pxVar8 = local_e0.state, (local_e0.state)->nbTrans == 0)) goto LAB_0017da96;
      }
LAB_0017daab:
      iVar7 = (int)pxVar8;
    } while (iVar10 == 2);
    if (iVar10 == 8) {
LAB_0017daea:
      if (local_e0.rollbacks != (xmlRegExecRollback *)0x0) {
        if (((xmlRegStatePtr)local_e0.counts != (xmlRegStatePtr)0x0) && (0 < local_e0.maxRollbacks))
        {
          lVar11 = 0x10;
          lVar12 = 0;
          do {
            pvVar4 = *(void **)((long)&(local_e0.rollbacks)->state + lVar11);
            if (pvVar4 != (void *)0x0) {
              (*xmlFree)(pvVar4);
            }
            lVar12 = lVar12 + 1;
            lVar11 = lVar11 + 0x18;
          } while (lVar12 < local_e0.maxRollbacks);
        }
        (*xmlFree)(local_e0.rollbacks);
      }
      if (local_e0.state == (xmlRegStatePtr)0x0) {
        iVar7 = -4;
      }
      else {
        if ((xmlRegStatePtr)local_e0.counts != (xmlRegStatePtr)0x0) {
          (*xmlFree)(local_e0.counts);
        }
        if (local_e0.status == 0) {
          iVar7 = 1;
        }
        else {
          iVar7 = local_e0.status;
          if (local_e0.status == -1) {
            iVar7 = 0;
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int
xmlRegexpExec(xmlRegexpPtr comp, const xmlChar *content) {
    if ((comp == NULL) || (content == NULL))
	return(-1);
    return(xmlFARegExec(comp, content));
}